

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

Vec_Int_t * Wlc_NtkCollectObjs(Wlc_Ntk_t *p,int fEven,int *pCount)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vObjs;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  vObjs = (Vec_Int_t *)malloc(0x10);
  vObjs->nCap = 100;
  vObjs->nSize = 0;
  piVar3 = (int *)malloc(400);
  vObjs->pArray = piVar3;
  Wlc_NtkCleanMarks(p);
  iVar2 = (p->vCos).nSize;
  if (iVar2 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar1 = (p->vCos).pArray[lVar5];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (((uint)lVar5 & 1) == fEven) {
        iVar2 = Wlc_NtkCollectObjs_rec(p,p->pObjs + iVar1,vObjs);
        iVar4 = iVar4 + iVar2;
        iVar2 = (p->vCos).nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  Wlc_NtkCleanMarks(p);
  if (pCount != (int *)0x0) {
    *pCount = iVar4;
  }
  return vObjs;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectObjs( Wlc_Ntk_t * p, int fEven, int * pCount )
{
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( (i & 1) == fEven )
            Count += Wlc_NtkCollectObjs_rec( p, pObj, vObjs );
    Wlc_NtkCleanMarks( p );
    if ( pCount )
        *pCount = Count;
    return vObjs;
}